

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestRunStats::~TestRunStats(TestRunStats *this)

{
  TestRunStats *this_local;
  
  ~TestRunStats(this);
  operator_delete(this);
  return;
}

Assistant:

TestRunStats::~TestRunStats() = default;